

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O1

SUNErrCode SUNErrHandler_Create(SUNErrHandlerFn eh_fn,void *eh_data,SUNErrHandler_conflict *eh_out)

{
  SUNErrCode SVar1;
  SUNErrHandler_conflict pSVar2;
  
  pSVar2 = (SUNErrHandler_conflict)malloc(0x18);
  if (pSVar2 == (SUNErrHandler_conflict)0x0) {
    SVar1 = -0x2704;
  }
  else {
    pSVar2->previous = (SUNErrHandler)0x0;
    pSVar2->call = eh_fn;
    pSVar2->data = eh_data;
    *eh_out = pSVar2;
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNErrHandler_Create(SUNErrHandlerFn eh_fn, void* eh_data,
                                SUNErrHandler* eh_out)
{
  SUNErrHandler eh = NULL;

  eh = (SUNErrHandler)malloc(sizeof(struct SUNErrHandler_));
  if (!eh) { return SUN_ERR_MALLOC_FAIL; }

  eh->previous = NULL;
  eh->call     = eh_fn;
  eh->data     = eh_data;

  *eh_out = eh;
  return SUN_SUCCESS;
}